

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

size_t __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
::capacity(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
           *this)

{
  CommonFields *this_00;
  size_t sVar1;
  size_t cap;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  *this_local;
  
  this_00 = common(this);
  sVar1 = CommonFields::capacity(this_00);
  return sVar1;
}

Assistant:

size_t capacity() const {
    const size_t cap = common().capacity();
    // Compiler complains when using functions in ASSUME so use local variable.
    ABSL_ATTRIBUTE_UNUSED static constexpr size_t kDefaultCapacity =
        DefaultCapacity();
    ABSL_ASSUME(cap >= kDefaultCapacity);
    return cap;
  }